

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_rawlen(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  
  uVar1 = *J->base & 0x1f000000;
  if (uVar1 == 0xb000000) {
    TVar2 = lj_ir_call(J,IRCALL_lj_tab_len);
  }
  else {
    if (uVar1 != 0x4000000) {
      return;
    }
    (J->fold).ins.field_0.op1 = (IRRef1)*J->base;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130000;
    TVar2 = lj_opt_fold(J);
  }
  *J->base = TVar2;
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawlen(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tref_isstr(tr))
    J->base[0] = emitir(IRTI(IR_FLOAD), tr, IRFL_STR_LEN);
  else if (tref_istab(tr))
    J->base[0] = lj_ir_call(J, IRCALL_lj_tab_len, tr);
  /* else: Interpreter will throw. */
  UNUSED(rd);
}